

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsFieldCompare(FmsField lhs,FmsField rhs)

{
  FmsFieldDescriptor lhs_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FmsInt FVar5;
  uint uVar6;
  
  if (lhs != rhs) {
    if (lhs == (FmsField)0x0) {
      uVar6 = 0xffffffff;
    }
    else if (rhs == (FmsField)0x0) {
      uVar6 = 0xfffffffe;
    }
    else {
      iVar3 = strcmp(lhs->name,rhs->name);
      lhs_00 = lhs->fd;
      iVar4 = FmsFieldDescriptorCompare(lhs_00,rhs->fd);
      uVar6 = (iVar3 != 0) + 10;
      if (iVar4 == 0) {
        uVar6 = (uint)(iVar3 != 0);
      }
      uVar1 = uVar6 + 100;
      if (lhs->num_vec_comp == rhs->num_vec_comp) {
        uVar1 = uVar6;
      }
      uVar2 = uVar1 + 1000;
      if (lhs->scalar_type == rhs->scalar_type) {
        uVar2 = uVar1;
      }
      uVar6 = uVar2 + 10000;
      if (lhs->layout == rhs->layout) {
        uVar6 = uVar2;
      }
      if (uVar6 == 0) {
        if (lhs_00 == (FmsFieldDescriptor)0x0) {
          FVar5 = 0;
        }
        else {
          FVar5 = lhs_00->num_dofs;
        }
        FVar5 = CompareScalarData(lhs->scalar_type,FVar5 * lhs->num_vec_comp,lhs->data,rhs->data);
        uVar6 = 100000;
        if (FVar5 == 0) {
          uVar6 = 0;
        }
      }
    }
    return uVar6;
  }
  return 0;
}

Assistant:

int FmsFieldCompare(FmsField lhs, FmsField rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return -1;
  if(!rhs) return -2;
  int diff = 0;

  if(strcmp(lhs->name, rhs->name)) {
    diff += 1;
  }

  if(FmsFieldDescriptorCompare(lhs->fd, rhs->fd)) {
    diff += 10;
  }

  if(lhs->num_vec_comp != rhs->num_vec_comp) {
    diff += 100;
  }

  if(lhs->scalar_type != rhs->scalar_type) {
    diff += 1000;
  }

  // Potentially shouldn't care about layout?
  if(lhs->layout != rhs->layout) {
    diff += 10000;
  }

  // Only compare the data arrays if everything has matched so far
  if(diff == 0) {
    FmsInt nvdim = lhs->num_vec_comp;
    FmsInt nDofs = 0;
    if(lhs->fd)
      nDofs = lhs->fd->num_dofs;
    if(CompareScalarData(lhs->scalar_type, nvdim * nDofs, lhs->data, rhs->data))
      diff += 100000;
  }

  return diff;
}